

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebugger.cxx
# Opt level: O0

watchpoint_id __thiscall
cmDebugger_impl::SetWatchpoint(cmDebugger_impl *this,string *expr,WatchpointType watchpointType)

{
  ptr *ppVar1;
  __shared_ptr_access<cmDebugger_impl::Watchpoint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *this_00;
  Watchpoint *this_01;
  element_type *peVar2;
  mapped_type *this_02;
  cmVariableWatch *this_03;
  ptr *watch;
  watchpoint_id nextId;
  lock_guard<std::mutex> l;
  WatchpointType watchpointType_local;
  string *expr_local;
  cmDebugger_impl *this_local;
  
  l._M_device._4_4_ = watchpointType;
  std::lock_guard<std::mutex>::lock_guard((lock_guard<std::mutex> *)&nextId,&this->breakpointMutex);
  watch = (ptr *)this->nextBreakId;
  this->nextBreakId =
       (size_t)((long)&(watch->
                       super___shared_ptr<cmDebugger_impl::Watchpoint,_(__gnu_cxx::_Lock_policy)2>).
                       _M_ptr + 1);
  this_00 = (__shared_ptr_access<cmDebugger_impl::Watchpoint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             *)operator_new(0x10);
  this_01 = (Watchpoint *)operator_new(0x40);
  Watchpoint::Watchpoint(this_01,this,(watchpoint_id)watch,l._M_device._4_4_,expr);
  std::shared_ptr<cmDebugger_impl::Watchpoint>::shared_ptr<cmDebugger_impl::Watchpoint,void>
            ((shared_ptr<cmDebugger_impl::Watchpoint> *)this_00,this_01);
  peVar2 = std::
           __shared_ptr_access<cmDebugger_impl::Watchpoint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->(this_00);
  peVar2->user_data = this_00;
  this_02 = std::
            map<unsigned_long,_std::weak_ptr<cmDebugger_impl::Watchpoint>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::weak_ptr<cmDebugger_impl::Watchpoint>_>_>_>
            ::operator[](&this->activeWatchpoints,(key_type_conflict1 *)&watch);
  std::weak_ptr<cmDebugger_impl::Watchpoint>::operator=
            (this_02,(shared_ptr<cmDebugger_impl::Watchpoint> *)this_00);
  this_03 = cmake::GetVariableWatch(this->CMakeInstance);
  cmVariableWatch::AddWatch(this_03,expr,WatchMethodCB,this_00,WatchMethodDelete);
  ppVar1 = watch;
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&nextId);
  return (watchpoint_id)ppVar1;
}

Assistant:

watchpoint_id SetWatchpoint(
    const std::string& expr,
    cmWatchpoint::WatchpointType watchpointType) override
  {
    // The pointer to a smart pointer mechanism isn't pretty, but it should be
    // safe.The idea is that we store away the control block into
    // activeWatchpoints as a weak ptr; and so if the VariableWatch is
    // destroyed first, the weak ptr just goes stale. If the debugger is
    // destroyed first, the weak_ptrs must still be valid, so in the
    // debugger_impl dtor we clear the debugger on all still-valid watchpoints,
    // and the watchpoint callback is a noop if the debugger field isn't set.

    // NOTE: This means we are safe for either order, but is still isn't thread
    // safe -- you can hit a race condition if you delete the cmVariableWatch
    // and the cmDebugger simultaneously in different threads. Since these
    // objects are both dtored in the main thread, this shouldn't be an issue.
    std::lock_guard<std::mutex> l(breakpointMutex);
    watchpoint_id nextId = nextBreakId++;
    auto watch =
      new Watchpoint::ptr(new Watchpoint(this, nextId, watchpointType, expr));

    // Looks odd for sure but we need to store away user_data we hand off to
    // AddWatch so we can remove the watch later on
    (*watch)->user_data = watch;
    activeWatchpoints[nextId] = *watch;

    this->CMakeInstance.GetVariableWatch()->AddWatch(expr, WatchMethodCB,
                                                     watch, WatchMethodDelete);
    return nextId;
  }